

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgscon.c
# Opt level: O0

void cgscon(char *norm,SuperMatrix *L,SuperMatrix *U,float anorm,float *rcond,SuperLUStat_t *stat,
           int *info)

{
  int iVar1;
  singlecomplex *x;
  bool local_16d;
  int_t local_16c;
  char local_168 [4];
  int nrow;
  char msg [256];
  int ii;
  int isave [3];
  singlecomplex *work;
  float ainvnm;
  int onenrm;
  int kase1;
  int kase;
  int *info_local;
  SuperLUStat_t *stat_local;
  float *rcond_local;
  SuperMatrix *pSStack_20;
  float anorm_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *norm_local;
  
  *info = 0;
  local_16d = true;
  _kase1 = info;
  info_local = (int *)stat;
  stat_local = (SuperLUStat_t *)rcond;
  rcond_local._4_4_ = anorm;
  pSStack_20 = U;
  U_local = L;
  L_local = (SuperMatrix *)norm;
  if (*norm != '1') {
    iVar1 = strncmp(norm,"O",1);
    local_16d = iVar1 == 0;
  }
  work._4_4_ = (uint)local_16d;
  if ((work._4_4_ == 0) && (iVar1 = strncmp((char *)L_local,"I",1), iVar1 != 0)) {
    *_kase1 = -1;
  }
  else if ((((U_local->nrow < 0) || (U_local->nrow != U_local->ncol)) || (U_local->Stype != SLU_SC))
          || ((U_local->Dtype != SLU_C || (U_local->Mtype != SLU_TRLU)))) {
    *_kase1 = -2;
  }
  else if (((pSStack_20->nrow < 0) || (pSStack_20->nrow != pSStack_20->ncol)) ||
          ((pSStack_20->Stype != SLU_NC ||
           ((pSStack_20->Dtype != SLU_C || (pSStack_20->Mtype != SLU_TRU)))))) {
    *_kase1 = -3;
  }
  if (*_kase1 == 0) {
    *(undefined4 *)&stat_local->panel_histo = 0;
    if ((U_local->nrow == 0) || (pSStack_20->nrow == 0)) {
      *(undefined4 *)&stat_local->panel_histo = 0x3f800000;
    }
    else {
      x = singlecomplexCalloc((long)(U_local->nrow * 3));
      if (x == (singlecomplex *)0x0) {
        sprintf(local_168,"%s at line %d in file %s\n","Malloc fails for work arrays in cgscon.",
                0x7f,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgscon.c")
        ;
        superlu_abort_and_exit(local_168);
      }
      work._0_4_ = 0.0;
      if (work._4_4_ == 0) {
        ainvnm = 2.8026e-45;
      }
      else {
        ainvnm = 1.4013e-45;
      }
      onenrm = 0;
      local_16c = U_local->nrow;
      do {
        clacon2_(&local_16c,x + U_local->nrow,x,(float *)&work,&onenrm,(int *)(msg + 0xfc));
        if (onenrm == 0) break;
        if ((float)onenrm == ainvnm) {
          sp_ctrsv("L","No trans","Unit",U_local,pSStack_20,x,(SuperLUStat_t *)info_local,_kase1);
          sp_ctrsv("U","No trans","Non-unit",U_local,pSStack_20,x,(SuperLUStat_t *)info_local,_kase1
                  );
        }
        else {
          sp_ctrsv("U","Transpose","Non-unit",U_local,pSStack_20,x,(SuperLUStat_t *)info_local,
                   _kase1);
          sp_ctrsv("L","Transpose","Unit",U_local,pSStack_20,x,(SuperLUStat_t *)info_local,_kase1);
        }
      } while (onenrm != 0);
      if ((work._0_4_ != 0.0) || (NAN(work._0_4_))) {
        *(float *)&stat_local->panel_histo = (1.0 / work._0_4_) / rcond_local._4_4_;
      }
      superlu_free(x);
    }
  }
  else {
    msg._248_4_ = -*_kase1;
    input_error("cgscon",(int *)(msg + 0xf8));
  }
  return;
}

Assistant:

void
cgscon(char *norm, SuperMatrix *L, SuperMatrix *U,
       float anorm, float *rcond, SuperLUStat_t *stat, int *info)
{


    /* Local variables */
    int    kase, kase1, onenrm;
    float ainvnm;
    singlecomplex *work;
    int    isave[3];
    extern int crscl_(int *, singlecomplex *, singlecomplex *, int *);

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    
    /* Test the input parameters. */
    *info = 0;
    onenrm = *(unsigned char *)norm == '1' || strncmp(norm, "O", 1)==0;
    if (! onenrm && strncmp(norm, "I", 1)!=0) *info = -1;
    else if (L->nrow < 0 || L->nrow != L->ncol ||
             L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU)
	 *info = -2;
    else if (U->nrow < 0 || U->nrow != U->ncol ||
             U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU) 
	*info = -3;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgscon", &ii);
	return;
    }

    /* Quick return if possible */
    *rcond = 0.;
    if ( L->nrow == 0 || U->nrow == 0) {
	*rcond = 1.;
	return;
    }

    work = singlecomplexCalloc( 3*L->nrow );


    if ( !work )
	ABORT("Malloc fails for work arrays in cgscon.");
    
    /* Estimate the norm of inv(A). */
    ainvnm = 0.;
    if ( onenrm ) kase1 = 1;
    else kase1 = 2;
    kase = 0;

    int nrow = L->nrow;

    do {
	clacon2_(&nrow, &work[L->nrow], &work[0], &ainvnm, &kase, isave);

	if (kase == 0) break;

	if (kase == kase1) {
	    /* Multiply by inv(L). */
	    sp_ctrsv("L", "No trans", "Unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(U). */
	    sp_ctrsv("U", "No trans", "Non-unit", L, U, &work[0], stat, info);
	    
	} else {

	    /* Multiply by inv(U'). */
	    sp_ctrsv("U", "Transpose", "Non-unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(L'). */
	    sp_ctrsv("L", "Transpose", "Unit", L, U, &work[0], stat, info);
	    
	}

    } while ( kase != 0 );

    /* Compute the estimate of the reciprocal condition number. */
    if (ainvnm != 0.) *rcond = (1. / ainvnm) / anorm;

    SUPERLU_FREE (work);
    return;

}